

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O0

string * __thiscall
glcts::GeometryShaderGetProgramiv3Test::getGSCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderGetProgramiv3Test *this,_run *run)

{
  ostream *poVar1;
  string local_1f8;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream code_sstream;
  ostream local_198;
  _run *local_20;
  _run *run_local;
  GeometryShaderGetProgramiv3Test *this_local;
  
  local_20 = run;
  run_local = (_run *)this;
  this_local = (GeometryShaderGetProgramiv3Test *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(&local_198,"${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout(");
  getLayoutQualifierForPrimitiveType_abi_cxx11_(&local_1d8,this,local_20->input_primitive_type);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d8);
  poVar1 = std::operator<<(poVar1,", invocations = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20->invocations);
  poVar1 = std::operator<<(poVar1,") in;\nlayout(");
  getLayoutQualifierForPrimitiveType_abi_cxx11_(&local_1f8,this,local_20->output_primitive_type);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f8);
  poVar1 = std::operator<<(poVar1,", max_vertices = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20->max_vertices);
  poVar1 = std::operator<<(poVar1,
                           ") out;\n\nout gl_PerVertex {\n    vec4 gl_Position;\n};\n\nvoid main()\n{\n    for (int n = 0; n < "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20->max_vertices);
  std::operator<<(poVar1,
                  "; ++n)\n    {\n        gl_Position = vec4(n, 0.0, 0.0, 1.0);\n        EmitVertex();\n    }\n\n    EndPrimitive();\n}\n"
                 );
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderGetProgramiv3Test::getGSCode(const _run& run)
{
	std::stringstream code_sstream;

	code_sstream << "${VERSION}\n"
					"${GEOMETRY_SHADER_REQUIRE}\n"
					"\n"
					"layout("
				 << getLayoutQualifierForPrimitiveType(run.input_primitive_type) << ", "
																					"invocations = "
				 << run.invocations << ") in;\n"
									   "layout("
				 << getLayoutQualifierForPrimitiveType(run.output_primitive_type) << ", "
																					 "max_vertices = "
				 << run.max_vertices << ") out;\n"
										"\n"
										"out gl_PerVertex {\n"
										"    vec4 gl_Position;\n"
										"};\n"
										"\n"
										"void main()\n"
										"{\n"
										"    for (int n = 0; n < "
				 << run.max_vertices << "; ++n)\n"
										"    {\n"
										"        gl_Position = vec4(n, 0.0, 0.0, 1.0);\n"
										"        EmitVertex();\n"
										"    }\n"
										"\n"
										"    EndPrimitive();\n"
										"}\n";

	return code_sstream.str();
}